

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O1

void setImageLayout(ktxVulkanFunctions vkFuncs,VkCommandBuffer cmdBuffer,VkImage image,
                   VkImageLayout oldLayout,VkImageLayout newLayout,
                   VkImageSubresourceRange subresourceRange)

{
  VkImageMemoryBarrier local_48;
  
  local_48.pNext = (void *)0x0;
  local_48.srcAccessMask = 0;
  local_48.dstAccessMask = 0;
  local_48.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  local_48._4_4_ = 0;
  local_48.srcQueueFamilyIndex = 0xffffffff;
  local_48.dstQueueFamilyIndex = 0xffffffff;
  local_48.newLayout = newLayout;
  local_48.oldLayout = oldLayout;
  local_48.subresourceRange.aspectMask = subresourceRange.aspectMask;
  local_48.subresourceRange.baseMipLevel = subresourceRange.baseMipLevel;
  local_48.subresourceRange.levelCount = subresourceRange.levelCount;
  local_48.subresourceRange.baseArrayLayer = subresourceRange.baseArrayLayer;
  local_48._68_4_ = 0;
  local_48.subresourceRange.layerCount = subresourceRange.layerCount;
  local_48.image = image;
  if ((oldLayout < (VK_IMAGE_LAYOUT_PREINITIALIZED|VK_IMAGE_LAYOUT_GENERAL)) &&
     ((0x1edU >> (oldLayout & 0x1f) & 1) != 0)) {
    local_48.srcAccessMask = *(VkAccessFlags *)(&DAT_00319648 + (ulong)oldLayout * 4);
    local_48.dstAccessMask = 0;
    switch(newLayout) {
    case VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:
      local_48.srcAccessMask = 0x800;
      local_48.dstAccessMask = 0x100;
      break;
    case VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:
      local_48.dstAccessMask = 0x400;
      break;
    default:
      __assert_fail("KTX_FALSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                    ,0x6f8,
                    "void setImageLayout(ktxVulkanFunctions, VkCommandBuffer, VkImage, VkImageLayout, VkImageLayout, VkImageSubresourceRange)"
                   );
    case VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:
      local_48.dstAccessMask = 0x20;
      if (local_48.srcAccessMask == 0) {
        local_48.srcAccessMask = 0x5000;
      }
      break;
    case VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:
      local_48.srcAccessMask = local_48.srcAccessMask | 0x800;
      local_48.dstAccessMask = 0x800;
      break;
    case VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:
      local_48.dstAccessMask = 0x1000;
    }
    (*vkFuncs.vkCmdPipelineBarrier)
              (cmdBuffer,0x10000,0x10000,0,0,(VkMemoryBarrier *)0x0,0,(VkBufferMemoryBarrier *)0x0,1
               ,&local_48);
    return;
  }
  __assert_fail("KTX_FALSE",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                ,0x6c9,
                "void setImageLayout(ktxVulkanFunctions, VkCommandBuffer, VkImage, VkImageLayout, VkImageLayout, VkImageSubresourceRange)"
               );
}

Assistant:

static void
setImageLayout(
    ktxVulkanFunctions vkFuncs,
    VkCommandBuffer cmdBuffer,
    VkImage image,
    VkImageLayout oldLayout,
    VkImageLayout newLayout,
    VkImageSubresourceRange subresourceRange)
{
    // Create an image barrier object
    VkImageMemoryBarrier imageMemoryBarrier = {
        .sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
        .pNext = NULL,
         // Some default values
        .srcQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED,
        .dstQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED
    };

    imageMemoryBarrier.oldLayout = oldLayout;
    imageMemoryBarrier.newLayout = newLayout;
    imageMemoryBarrier.image = image;
    imageMemoryBarrier.subresourceRange = subresourceRange;

    // Source layouts (old)
    // The source access mask controls actions to be finished on the old
    // layout before it will be transitioned to the new layout.
    switch (oldLayout)
    {
    case VK_IMAGE_LAYOUT_UNDEFINED:
        // Image layout is undefined (or does not matter).
        // Only valid as initial layout. No flags required.
        imageMemoryBarrier.srcAccessMask = 0;
        break;

    case VK_IMAGE_LAYOUT_PREINITIALIZED:
        // Image is preinitialized.
        // Only valid as initial layout for linear images; preserves memory
        // contents. Make sure host writes have finished.
        imageMemoryBarrier.srcAccessMask = VK_ACCESS_HOST_WRITE_BIT;
        break;

    case VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:
        // Image is a color attachment.
        // Make sure writes to the color buffer have finished
        imageMemoryBarrier.srcAccessMask = VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT;
        break;

    case VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:
        // Image is a depth/stencil attachment.
        // Make sure any writes to the depth/stencil buffer have finished.
        imageMemoryBarrier.srcAccessMask
                                = VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT;
        break;

    case VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:
        // Image is a transfer source.
        // Make sure any reads from the image have finished
        imageMemoryBarrier.srcAccessMask = VK_ACCESS_TRANSFER_READ_BIT;
        break;

    case VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:
        // Image is a transfer destination.
        // Make sure any writes to the image have finished.
        imageMemoryBarrier.srcAccessMask = VK_ACCESS_TRANSFER_WRITE_BIT;
        break;

    case VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:
        // Image is read by a shader.
        // Make sure any shader reads from the image have finished
        imageMemoryBarrier.srcAccessMask = VK_ACCESS_SHADER_READ_BIT;
        break;

    default:
        /* Value not used by callers, so not supported. */
        assert(KTX_FALSE);
    }

    // Target layouts (new)
    // The destination access mask controls the dependency for the new image
    // layout.
    switch (newLayout)
    {
    case VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:
        // Image will be used as a transfer destination.
        // Make sure any writes to the image have finished.
        imageMemoryBarrier.dstAccessMask = VK_ACCESS_TRANSFER_WRITE_BIT;
        break;

    case VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:
        // Image will be used as a transfer source.
        // Make sure any reads from and writes to the image have finished.
        imageMemoryBarrier.srcAccessMask |= VK_ACCESS_TRANSFER_READ_BIT;
        imageMemoryBarrier.dstAccessMask = VK_ACCESS_TRANSFER_READ_BIT;
        break;

    case VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:
        // Image will be used as a color attachment.
        // Make sure any writes to the color buffer have finished.
        imageMemoryBarrier.srcAccessMask = VK_ACCESS_TRANSFER_READ_BIT;
        imageMemoryBarrier.dstAccessMask = VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT;
        break;

    case VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:
        // Image layout will be used as a depth/stencil attachment.
        // Make sure any writes to depth/stencil buffer have finished.
        imageMemoryBarrier.dstAccessMask
                                = VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT;
        break;

    case VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:
        // Image will be read in a shader (sampler, input attachment).
        // Make sure any writes to the image have finished.
        if (imageMemoryBarrier.srcAccessMask == 0)
        {
            imageMemoryBarrier.srcAccessMask
                    = VK_ACCESS_HOST_WRITE_BIT | VK_ACCESS_TRANSFER_WRITE_BIT;
        }
        imageMemoryBarrier.dstAccessMask = VK_ACCESS_SHADER_READ_BIT;
        break;
    default:
        /* Value not used by callers, so not supported. */
        assert(KTX_FALSE);
    }

    // Put barrier on top of pipeline.
    VkPipelineStageFlags srcStageFlags = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;
    VkPipelineStageFlags destStageFlags = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;

    // Add the barrier to the passed command buffer
    vkFuncs.vkCmdPipelineBarrier(
        cmdBuffer,
        srcStageFlags,
        destStageFlags,
        0,
        0, NULL,
        0, NULL,
        1, &imageMemoryBarrier);
}